

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

bool __thiscall QWizardPrivate::ensureButton(QWizardPrivate *this,WizardButton which)

{
  long lVar1;
  QWizardPrivate *wizardPrivate;
  QWizardPrivate *this_00;
  QWizardPrivate *pQVar2;
  uint in_ESI;
  QWizardPrivate *in_RDI;
  long in_FS_OFFSET;
  QStyle *style;
  QPushButton *pushButton;
  QWizard *q;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  QObject *in_stack_ffffffffffffff70;
  QWizardPrivate *pQVar3;
  QWidget *in_stack_ffffffffffffff78;
  QWizardPrivate *this_01;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_ESI < 9) {
    if (*(long *)((long)&in_RDI->field_20 + (long)(int)in_ESI * 8) == 0) {
      wizardPrivate = (QWizardPrivate *)operator_new(0x28);
      QPushButton::QPushButton((QPushButton *)wizardPrivate,in_stack_ffffffffffffff78);
      this_01 = wizardPrivate;
      this_00 = (QWizardPrivate *)
                QWidget::style((QWidget *)
                               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      pQVar3 = this_00;
      pQVar2 = (QWizardPrivate *)QApplication::style();
      if (this_00 != pQVar2) {
        QWidget::setStyle((QWidget *)this_01,(QStyle *)pQVar3);
      }
      pQVar3 = this_01;
      object_name_for_button((WizardButton)((ulong)wizardPrivate >> 0x20));
      QObject::setObjectName<void>
                (in_stack_ffffffffffffff70,
                 (QString *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      QString::~QString((QString *)0x7b4a6b);
      QWidget::hide((QWidget *)0x7b4a75);
      *(QWizardPrivate **)((long)&in_RDI->field_20 + (long)(int)in_ESI * 8) = pQVar3;
      if ((int)in_ESI < 6) {
        buttonDefaultText((int)((ulong)this_00 >> 0x20),(int)this_00,wizardPrivate);
        QAbstractButton::setText((QAbstractButton *)this_01,(QString *)pQVar3);
        QString::~QString((QString *)0x7b4acf);
      }
      connectButton(this_00,(WizardButton)((ulong)wizardPrivate >> 0x20));
    }
    local_39 = true;
  }
  else {
    local_39 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QWizardPrivate::ensureButton(QWizard::WizardButton which) const
{
    Q_Q(const QWizard);
    if (uint(which) >= QWizard::NButtons)
        return false;

    if (!btns[which]) {
        QPushButton *pushButton = new QPushButton(antiFlickerWidget);
        QStyle *style = q->style();
        if (style != QApplication::style()) // Propagate style
            pushButton->setStyle(style);
        pushButton->setObjectName(object_name_for_button(which));
#ifdef Q_OS_MACOS
        pushButton->setAutoDefault(false);
#endif
        pushButton->hide();
#ifdef Q_CC_HPACC
        const_cast<QWizardPrivate *>(this)->btns[which] = pushButton;
#else
        btns[which] = pushButton;
#endif
        if (which < QWizard::NStandardButtons)
            pushButton->setText(buttonDefaultText(wizStyle, which, this));

        connectButton(which);
    }
    return true;
}